

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

void __thiscall
Qentem::QTest::PrintErrorMessage<Qentem::StringStream<char>,char[13]>
          (QTest *this,bool equal,StringStream<char> *value1,char (*value2) [13],unsigned_long line)

{
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  undefined7 in_register_00000031;
  wostream *pwVar2;
  char *pcVar3;
  char local_41;
  char *local_40;
  char *local_38;
  
  local_38 = TestOutPut::GetColor(ERROR);
  local_40 = TestOutPut::GetColor(END);
  local_41 = '\n';
  TestOutPut::Print<char_const*,char[7],char_const*,char[3],char_const*,char>
            (&local_38,(char (*) [7])"Failed",&local_40,(char (*) [3])0x119076,&this->part_name_,
             &local_41);
  pcVar3 = " ";
  if ((int)CONCAT71(in_register_00000031,equal) != 0) {
    pcVar3 = " not ";
  }
  if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
    pwVar2 = (wostream *)&std::wcout;
  }
  else {
    pwVar2 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
  }
  pwVar2 = std::operator<<(pwVar2,this->file_fullname_);
  pwVar2 = std::operator<<(pwVar2,":");
  pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
  pwVar2 = std::operator<<(pwVar2,":\n Should");
  pwVar2 = std::operator<<(pwVar2,pcVar3);
  pwVar2 = std::operator<<(pwVar2,"equal: `");
  pwVar2 = std::operator<<(pwVar2,*value2);
  pwVar2 = std::operator<<(pwVar2,"`\n     Returned: `");
  pbVar1 = operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)pwVar2,value1);
  std::operator<<((wostream *)pbVar1,"`\n\n");
  return;
}

Assistant:

QENTEM_NOINLINE void PrintErrorMessage(bool equal, const Value1_T &value1, const Value2_T &value2,
                                           unsigned long line) {
        TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::ERROR), "Failed",
                          TestOutPut::GetColor(TestOutPut::Colors::END), ": ", part_name_, '\n');
        TestOutPut::Print(file_fullname_, ":", line, ":\n Should", (equal ? " not " : " "), "equal: `", value2,
                          "`\n     Returned: `", value1, "`\n\n");
    }